

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit_suite.cpp
# Opt level: O0

void implicit_value_suite::visit_integer(void)

{
  undefined4 local_2e4;
  value local_2e0;
  visitor local_2d9;
  undefined1 local_2d8 [7];
  visitor vis_9;
  variable data_9;
  unsigned_long_long value_9;
  value local_290;
  visitor local_289;
  undefined1 local_288 [7];
  visitor vis_8;
  variable data_8;
  longlong value_8;
  value local_240;
  visitor local_239;
  undefined1 local_238 [7];
  visitor vis_7;
  variable data_7;
  unsigned_long value_7;
  value local_1f0;
  visitor local_1e9;
  undefined1 local_1e8 [7];
  visitor vis_6;
  variable data_6;
  long value_6;
  value local_1a0;
  visitor local_199;
  undefined1 local_198 [7];
  visitor vis_5;
  variable data_5;
  uint value_5;
  visitor local_159;
  undefined1 local_158 [7];
  visitor vis_4;
  variable data_4;
  int value_4;
  visitor local_119;
  undefined1 local_118 [7];
  visitor vis_3;
  variable data_3;
  value vStack_e0;
  unsigned_short value_3;
  visitor local_d9;
  undefined1 local_d8 [7];
  visitor vis_2;
  variable data_2;
  value vStack_a0;
  short value_2;
  visitor local_99;
  undefined1 local_98 [7];
  visitor vis_1;
  variable data_1;
  undefined4 local_60;
  uchar value_1;
  value local_50;
  visitor local_49;
  undefined1 local_48 [7];
  visitor vis;
  variable data;
  char value;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<signed_char>
            ((basic_variable<std::allocator<char>_> *)local_48,'\x02');
  local_50 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                       (&local_49,(basic_variable<std::allocator<char>_> *)local_48);
  local_60 = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::signed_char",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x13b,"void implicit_value_suite::visit_integer()",&local_50,&local_60);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_char>
            ((basic_variable<std::allocator<char>_> *)local_98,'\x02');
  vStack_a0 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                        (&local_99,(basic_variable<std::allocator<char>_> *)local_98);
  data_2.storage._44_4_ = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::unsigned_char",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x141,"void implicit_value_suite::visit_integer()",&stack0xffffffffffffff60,
             &data_2.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_98);
  data_2.storage._42_2_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<short>
            ((basic_variable<std::allocator<char>_> *)local_d8,2);
  vStack_e0 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                        (&local_d9,(basic_variable<std::allocator<char>_> *)local_d8);
  data_3.storage._44_4_ = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::signed_short_integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x147,"void implicit_value_suite::visit_integer()",&stack0xffffffffffffff20,
             &data_3.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d8);
  data_3.storage._42_2_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_short>
            ((basic_variable<std::allocator<char>_> *)local_118,2);
  value_4 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                      (&local_119,(basic_variable<std::allocator<char>_> *)local_118);
  data_4.storage._44_4_ = 5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::unsigned_short_integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x14d,"void implicit_value_suite::visit_integer()",&value_4,&data_4.storage.field_0x2c
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_118);
  data_4.storage._40_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_158,2);
  value_5 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                      (&local_159,(basic_variable<std::allocator<char>_> *)local_158);
  data_5.storage._44_4_ = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::signed_integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x153,"void implicit_value_suite::visit_integer()",&value_5,&data_5.storage.field_0x2c
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_158);
  data_5.storage._40_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_198,2);
  local_1a0 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                        (&local_199,(basic_variable<std::allocator<char>_> *)local_198);
  value_6._4_4_ = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::unsigned_integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x159,"void implicit_value_suite::visit_integer()",&local_1a0,(long)&value_6 + 4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long>
            ((basic_variable<std::allocator<char>_> *)local_1e8,2);
  local_1f0 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                        (&local_1e9,(basic_variable<std::allocator<char>_> *)local_1e8);
  value_7._4_4_ = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::signed_long_integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x15f,"void implicit_value_suite::visit_integer()",&local_1f0,(long)&value_7 + 4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long>
            ((basic_variable<std::allocator<char>_> *)local_238,2);
  local_240 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                        (&local_239,(basic_variable<std::allocator<char>_> *)local_238);
  value_8._4_4_ = 9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::unsigned_long_integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x165,"void implicit_value_suite::visit_integer()",&local_240,(long)&value_8 + 4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_long>
            ((basic_variable<std::allocator<char>_> *)local_288,2);
  local_290 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                        (&local_289,(basic_variable<std::allocator<char>_> *)local_288);
  value_9._4_4_ = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::signed_long_long_integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x16b,"void implicit_value_suite::visit_integer()",&local_290,(long)&value_9 + 4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long_long>
            ((basic_variable<std::allocator<char>_> *)local_2d8,2);
  local_2e0 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                        (&local_2d9,(basic_variable<std::allocator<char>_> *)local_2d8);
  local_2e4 = 0xb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::unsigned_long_long_integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x171,"void implicit_value_suite::visit_integer()",&local_2e0,&local_2e4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2d8);
  return;
}

Assistant:

void visit_integer()
{
    {
        signed char value = 2;
        variable data(value);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::signed_char);
    }
    {
        unsigned char value = 2U;
        variable data(value);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::unsigned_char);
    }
    {
        signed short int value = 2;
        variable data(value);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::signed_short_integer);
    }
    {
        unsigned short int value = 2U;
        variable data(value);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::unsigned_short_integer);
    }
    {
        signed int value = 2;
        variable data(value);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::signed_integer);
    }
    {
        unsigned int value = 2U;
        variable data(value);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::unsigned_integer);
    }
    {
        signed long int value = 2L;
        variable data(value);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::signed_long_integer);
    }
    {
        unsigned long int value = 2UL;
        variable data(value);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::unsigned_long_integer);
    }
    {
        signed long long int value = 2LL;
        variable data(value);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::signed_long_long_integer);
    }
    {
        unsigned long long int value = 2ULL;
        variable data(value);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::unsigned_long_long_integer);
    }
}